

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.h
# Opt level: O1

void __thiscall ast::Instruction::check_alignment(Instruction *this)

{
  string local_30;
  
  if (((this->super_Statement).section_offset & 1) != 0) {
    string_printf_abi_cxx11_
              (&local_30,
               "Misaligned address - instruction binary code must be located in an even address");
    warning_report(&(this->super_Statement).location,&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void check_alignment() {
		if ((section_offset & 1) != 0)
			warning_report(&location,
				string_printf("Misaligned address - "
					"instruction binary code must be located in an even address"));
	}